

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

int __thiscall CMU462::Application::init(Application *this,EVP_PKEY_CTX *ctx)

{
  Timeline *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Scene *this_01;
  bool bVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar4;
  undefined7 extraout_var;
  CameraInfo CStack_a8;
  
  this_01 = this->scene;
  if (this_01 != (Scene *)0x0) {
    DynamicScene::Scene::~Scene(this_01);
    operator_delete(this_01);
    this->scene = (Scene *)0x0;
  }
  OSDText::init(&this->textManager,(EVP_PKEY_CTX *)(ulong)(this->super_Renderer).use_hdpi);
  (this->text_color).r = 1.0;
  (this->text_color).g = 1.0;
  (this->text_color).b = 1.0;
  (this->text_color).a = 1.0;
  this->leftDown = false;
  this->rightDown = false;
  this->middleDown = false;
  this->show_coordinates = true;
  this->show_hud = true;
  glEnable(0xb50);
  glEnable(0xb20);
  glEnable(0xb10);
  glHint(0xc52,0x1102);
  glHint(0xc51,0x1102);
  (*__glewGenFramebuffers)(1,&this->backface_fbo);
  (*__glewGenFramebuffers)(1,&this->frntface_fbo);
  glGenTextures(1,&this->backface_color_tex);
  glGenTextures(1,&this->backface_depth_tex);
  glGenTextures(1,&this->frntface_color_tex);
  glGenTextures(1,&this->frntface_depth_tex);
  initialize_style(this);
  *(undefined8 *)&(this->super_Renderer).field_0xc = 0;
  this->scene = (Scene *)0x0;
  this->screenH = 600;
  this->screenW = 600;
  paVar1 = &CStack_a8.super_Instance.id.field_2;
  CStack_a8.super_Instance.id._M_string_length = 0;
  CStack_a8.super_Instance.id.field_2._M_local_buf[0] = '\0';
  paVar2 = &CStack_a8.super_Instance.name.field_2;
  CStack_a8.super_Instance.name._M_string_length = 0;
  CStack_a8.super_Instance.name.field_2._M_local_buf[0] = '\0';
  CStack_a8.view_dir.x = 0.0;
  CStack_a8.view_dir.y = 0.0;
  CStack_a8.view_dir.z = 0.0;
  CStack_a8.up_dir.x = 0.0;
  CStack_a8.up_dir.y = 0.0;
  CStack_a8.up_dir.z = 0.0;
  CStack_a8.hFov = 20.0;
  CStack_a8.vFov = 28.0;
  CStack_a8.nClip = 0.1;
  CStack_a8.fClip = 100.0;
  CStack_a8.super_Instance.id._M_dataplus._M_p = (pointer)paVar1;
  CStack_a8.super_Instance.name._M_dataplus._M_p = (pointer)paVar2;
  Camera::configure(&this->camera,&CStack_a8,600,600);
  Camera::configure(&this->canonicalCamera,&CStack_a8,this->screenW,this->screenH);
  this_00 = &this->timeline;
  Timeline::setMaxFrame(this_00,300);
  Timeline::action_rewind(this_00);
  Timeline::resize(this_00,(int)this->screenW,0x40);
  Timeline::move(this_00,0,(int)this->screenH + -0x40);
  bVar3 = Timeline::markTime(this_00,0);
  iVar4 = (int)CONCAT71(extraout_var,bVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CStack_a8.super_Instance.name._M_dataplus._M_p != paVar2) {
    operator_delete(CStack_a8.super_Instance.name._M_dataplus._M_p);
    iVar4 = extraout_EAX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CStack_a8.super_Instance.id._M_dataplus._M_p != paVar1) {
    operator_delete(CStack_a8.super_Instance.id._M_dataplus._M_p);
    iVar4 = extraout_EAX_00;
  }
  return iVar4;
}

Assistant:

void Application::init() {
  if (scene != nullptr) {
    delete scene;
    scene = nullptr;
  }

  textManager.init(use_hdpi);
  text_color = Color(1.0, 1.0, 1.0);

  // Setup all the basic internal state to default values,
  // as well as some basic OpenGL state (like depth testing
  // and lighting).

  // Set the integer bit vector representing which keys are down.
  leftDown = false;
  rightDown = false;
  middleDown = false;

  show_coordinates = true;
  show_hud = true;

  // Lighting needs to be explicitly enabled.
  glEnable(GL_LIGHTING);

  // Enable anti-aliasing and circular points.
  glEnable(GL_LINE_SMOOTH);
  // glEnable( GL_POLYGON_SMOOTH ); // XXX causes cracks!
  glEnable(GL_POINT_SMOOTH);
  glHint(GL_LINE_SMOOTH_HINT, GL_NICEST);
  // glHint( GL_POLYGON_SMOOTH_HINT, GL_NICEST );
  glHint(GL_POINT_SMOOTH_HINT, GL_NICEST);

  // initialize fbos
  glGenFramebuffers(1, &backface_fbo);
  glGenFramebuffers(1, &frntface_fbo);
  glGenTextures(1, &backface_color_tex);
  glGenTextures(1, &backface_depth_tex);
  glGenTextures(1, &frntface_color_tex);
  glGenTextures(1, &frntface_depth_tex);

  // Initialize styles (colors, line widths, etc.) that will be used
  // to draw different types of mesh elements in various situations.
  initialize_style();

  mode = MODEL_MODE;
  action = Action::Navigate;
  scene = nullptr;

  // Make a dummy camera so resize() doesn't crash before the scene has been
  // loaded.
  // NOTE: there's a chicken-and-egg problem here, because load()
  // requires init, and init requires init_camera (which is only called by
  // load()).
  screenW = screenH = 600;  // Default value
  CameraInfo cameraInfo;
  cameraInfo.hFov = 20;
  cameraInfo.vFov = 28;
  cameraInfo.nClip = 0.1;
  cameraInfo.fClip = 100;
  camera.configure(cameraInfo, screenW, screenH);
  canonicalCamera.configure(cameraInfo, screenW, screenH);

  // Now initialize the timeline
  timeline.setMaxFrame(300);
  timeline.action_rewind();
  timeline.resize(screenW, 64);
  timeline.move(0, screenH - 64);
  timeline.markTime(0);
}